

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleShadingStateCase::iterate
          (SampleShadingStateCase *this)

{
  ostringstream *poVar1;
  TestLog *log;
  int iVar2;
  undefined4 extraout_var;
  CallLogWrapper gl;
  ResultCollector result;
  CallLogWrapper local_200;
  ResultCollector local_1e8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_200,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_1e8,log,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_200.m_enableLog = true;
  local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying initial value",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_120);
  gls::StateQueryUtil::verifyStateBoolean(&local_1e8,&local_200,0x8c36,false,this->m_verifier);
  local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying random values",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_120);
  glu::CallLogWrapper::glEnable(&local_200,0x8c36);
  gls::StateQueryUtil::verifyStateBoolean(&local_1e8,&local_200,0x8c36,true,this->m_verifier);
  glu::CallLogWrapper::glDisable(&local_200,0x8c36);
  gls::StateQueryUtil::verifyStateBoolean(&local_1e8,&local_200,0x8c36,false,this->m_verifier);
  tcu::ResultCollector::setTestContextResult
            (&local_1e8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_prefix._M_dataplus._M_p != &local_1e8.m_prefix.field_2) {
    operator_delete(local_1e8.m_prefix._M_dataplus._M_p,
                    local_1e8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_200);
  return STOP;
}

Assistant:

SampleShadingStateCase::IterateResult SampleShadingStateCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	gl.enableLogging(true);

	// initial
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying initial value" << tcu::TestLog::EndMessage;
		verifyStateBoolean(result, gl, GL_SAMPLE_SHADING, false, m_verifier);
	}

	// true and false too
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying random values" << tcu::TestLog::EndMessage;

		gl.glEnable(GL_SAMPLE_SHADING);
		verifyStateBoolean(result, gl, GL_SAMPLE_SHADING, true, m_verifier);

		gl.glDisable(GL_SAMPLE_SHADING);
		verifyStateBoolean(result, gl, GL_SAMPLE_SHADING, false, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}